

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

bool __thiscall cmMakefile::ReadListFile(cmMakefile *this,char *filename)

{
  pointer pbVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  char *in_base;
  cmListFile listFile;
  string filenametoread;
  allocator local_59;
  string local_58;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_58,filename,&local_59);
  in_base = cmState::Snapshot::GetCurrentSourceDirectory(&this->StateSnapshot);
  cmsys::SystemTools::CollapseFullPath(&local_30,&local_58,in_base);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->ListFileStack,&local_30);
  local_58._M_dataplus._M_p = (pointer)0x0;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity = 0;
  bVar3 = cmListFile::ParseFile((cmListFile *)&local_58,local_30._M_dataplus._M_p,false,this);
  if (bVar3) {
    PushPolicyBarrier(this);
    ReadListFile(this,(cmListFile *)&local_58,&local_30);
    bVar4 = true;
    if (cmSystemTools::s_FatalErrorOccured == false) {
      bVar4 = cmSystemTools::GetInterruptFlag();
    }
    PopPolicyBarrier(this,(bool)(bVar4 ^ 1));
    pbVar1 = (this->ListFileStack).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    (this->ListFileStack).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar1 + -1;
    pcVar2 = pbVar1[-1]._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &pbVar1[-1].field_2) {
      operator_delete(pcVar2,pbVar1[-1].field_2._M_allocated_capacity + 1);
    }
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::~vector
            ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool cmMakefile::ReadListFile(const char* filename)
{
  std::string filenametoread =
    cmSystemTools::CollapseFullPath(filename,
                                    this->GetCurrentSourceDirectory());

  this->ListFileStack.push_back(filenametoread);

  cmListFile listFile;
  if (!listFile.ParseFile(filenametoread.c_str(), false, this))
    {
    return false;
    }

  this->PushPolicyBarrier();
  this->ReadListFile(listFile, filenametoread);
  this->PopPolicyBarrier(!cmSystemTools::GetFatalErrorOccured());
  this->ListFileStack.pop_back();
  return true;
}